

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

bool __thiscall
el::base::TypedConfigurations::unsafeValidateFileRolling
          (TypedConfigurations *this,Level level,PreRollOutCallback *preRollOutCallback)

{
  fstream_t *fs;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *psVar1;
  unsigned_long uVar2;
  size_t __args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool bVar4;
  string fname;
  
  psVar1 = unsafeGetConfigByRef<std::shared_ptr<std::fstream>>
                     (this,level,&this->m_fileStreamMap,"fileStream");
  fs = (psVar1->
       super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr;
  bVar4 = true;
  if (fs != (fstream_t *)0x0) {
    uVar2 = unsafeGetConfigByVal<unsigned_long>
                      (this,level,&this->m_maxLogFileSizeMap,"maxLogFileSize");
    __args_1 = utils::File::getSizeOfFile(fs);
    if (uVar2 - 1 < __args_1) {
      pbVar3 = unsafeGetConfigByRef<std::__cxx11::string>
                         (this,level,&this->m_filenameMap,"filename");
      std::__cxx11::string::string((string *)&fname,(string *)pbVar3);
      std::fstream::close();
      utils::std::function<void_(const_char_*,_unsigned_long)>::operator()
                (preRollOutCallback,fname._M_dataplus._M_p,__args_1);
      std::fstream::open((string *)fs,(_Ios_Openmode)&fname);
      std::__cxx11::string::~string((string *)&fname);
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool TypedConfigurations::unsafeValidateFileRolling(Level level, const PreRollOutCallback& preRollOutCallback) {
  base::type::fstream_t* fs = unsafeGetConfigByRef(level, &m_fileStreamMap, "fileStream").get();
  if (fs == nullptr) {
    return true;
  }
  std::size_t maxLogFileSize = unsafeGetConfigByVal(level, &m_maxLogFileSizeMap, "maxLogFileSize");
  std::size_t currFileSize = base::utils::File::getSizeOfFile(fs);
  if (maxLogFileSize != 0 && currFileSize >= maxLogFileSize) {
    std::string fname = unsafeGetConfigByRef(level, &m_filenameMap, "filename");
    ELPP_INTERNAL_INFO(1, "Truncating log file [" << fname << "] as a result of configurations for level ["
                       << LevelHelper::convertToString(level) << "]");
    fs->close();
    preRollOutCallback(fname.c_str(), currFileSize);
    fs->open(fname, std::fstream::out | std::fstream::trunc);
    return true;
  }
  return false;
}